

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatImageTexture *
pbrt::FloatImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  WrapMode *args_4;
  FloatImageTexture *pFVar2;
  char *__s;
  allocator<char> local_f6;
  allocator<char> local_f5;
  Float local_f4;
  optional<pbrt::WrapMode> wrapMode;
  string encodingString;
  string filename;
  Float scale;
  Float maxAniso;
  ColorEncodingHandle encoding;
  string wrapString;
  string local_60;
  string filter;
  TextureMapping2DHandle map;
  Allocator alloc_local;
  
  alloc_local = alloc;
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filter,"maxanisotropy",(allocator<char> *)&wrapString);
  local_f4 = TextureParameterDictionary::GetOneFloat(parameters,&filter,8.0);
  std::__cxx11::string::~string((string *)&filter);
  maxAniso = local_f4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapString,"filter",(allocator<char> *)&encodingString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"bilinear",(allocator<char> *)&encoding);
  TextureParameterDictionary::GetOneString(&filter,parameters,&wrapString,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&wrapString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"wrap",(allocator<char> *)&encoding);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encodingString,"repeat",(allocator<char> *)&local_60);
  TextureParameterDictionary::GetOneString(&wrapString,parameters,&filename,&encodingString);
  std::__cxx11::string::~string((string *)&encodingString);
  std::__cxx11::string::~string((string *)&filename);
  ParseWrapMode((pbrt *)&wrapMode,wrapString._M_dataplus._M_p);
  if (wrapMode.set != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,"scale",(allocator<char> *)&encodingString);
    local_f4 = TextureParameterDictionary::GetOneFloat(parameters,&filename,1.0);
    std::__cxx11::string::~string((string *)&filename);
    scale = local_f4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&encoding,"filename",&local_f5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_f6);
    TextureParameterDictionary::GetOneString
              (&encodingString,parameters,(string *)&encoding,&local_60);
    ResolveFilename(&filename,&encodingString);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&encoding);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encodingString,"png",(allocator<char> *)&encoding);
    bVar1 = HasExtension(&filename,&encodingString);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::string<std::allocator<char>>((string *)&encoding,"encoding",&local_f5);
    __s = "linear";
    if (bVar1) {
      __s = "sRGB";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_f6);
    TextureParameterDictionary::GetOneString
              (&encodingString,parameters,(string *)&encoding,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&encoding);
    ColorEncodingHandle::Get((string *)&encoding);
    args_4 = pstd::optional<pbrt::WrapMode>::value(&wrapMode);
    pFVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,std::__cxx11::string&,float&,pbrt::WrapMode&,float&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&map,&filename,&filter,&maxAniso,args_4,&scale,&encoding,
                        &alloc_local);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::~string((string *)&filename);
    pstd::optional<pbrt::WrapMode>::~optional(&wrapMode);
    std::__cxx11::string::~string((string *)&wrapString);
    std::__cxx11::string::~string((string *)&filter);
    return pFVar2;
  }
  ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&wrapString);
}

Assistant:

FloatImageTexture *FloatImageTexture::Create(const Transform &renderFromTexture,
                                             const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString);

    return alloc.new_object<FloatImageTexture>(map, filename, filter, maxAniso, *wrapMode,
                                               scale, encoding, alloc);
}